

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O1

void __thiscall enact::VariableTypename::VariableTypename(VariableTypename *this,Token *identifier)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_Typename)._vptr_Typename = (_func_int **)&PTR__VariableTypename_00129940;
  (this->m_identifier).type = identifier->type;
  paVar1 = &(this->m_identifier).lexeme.field_2;
  (this->m_identifier).lexeme._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (identifier->lexeme)._M_dataplus._M_p;
  paVar2 = &(identifier->lexeme).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(identifier->lexeme).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_identifier).lexeme.field_2 + 8) = uVar4;
  }
  else {
    (this->m_identifier).lexeme._M_dataplus._M_p = pcVar3;
    (this->m_identifier).lexeme.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_identifier).lexeme._M_string_length = (identifier->lexeme)._M_string_length;
  (identifier->lexeme)._M_dataplus._M_p = (pointer)paVar2;
  (identifier->lexeme)._M_string_length = 0;
  (identifier->lexeme).field_2._M_local_buf[0] = '\0';
  (this->m_identifier).col = identifier->col;
  (this->m_identifier).line = identifier->line;
  std::operator+(&this->m_name,"$",&(this->m_identifier).lexeme);
  return;
}

Assistant:

VariableTypename::VariableTypename(Token identifier) :
            m_identifier{std::move(identifier)},
            m_name{"$" + m_identifier.lexeme} {
    }